

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

pattern * numericItem(int signFactor)

{
  char cVar1;
  pattern *ppVar2;
  ushort **ppuVar3;
  pattern *ppVar4;
  pattern *rhs;
  int iVar5;
  
  ppVar2 = makeTerminal(0x134,signFactor * tokenval);
  cVar1 = lexbuf[0];
  matchTok(0x191);
  ppuVar3 = __ctype_b_loc();
  if ((byte)(cVar1 == ' ' | (*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 4) >> 2) == 1) {
    ppVar4 = makeTerminal(0x140,(int)cVar1);
    ppVar2 = makeNode(ppVar2,ppVar4,0x12d);
  }
  if (lookahead == 0x2d) {
    matchTok(0x2d);
    iVar5 = 1;
    if (lookahead == 0x2d) {
      matchTok(0x2d);
      iVar5 = -1;
    }
    ppVar4 = makeTerminal(0x134,iVar5 * tokenval);
    cVar1 = lexbuf[0];
    matchTok(0x191);
    if ((byte)(cVar1 == ' ' | (*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 4) >> 2) == 1) {
      rhs = makeTerminal(0x140,(int)cVar1);
      ppVar4 = makeNode(ppVar4,rhs,0x12d);
    }
    iVar5 = 0x141;
    if (ppVar2->type != 0x12d) {
      iVar5 = 0x12f;
      if (ppVar4->type == 0x12d) {
        iVar5 = 0x141;
      }
    }
    ppVar2 = makeNode(ppVar2,ppVar4,iVar5);
    return ppVar2;
  }
  return ppVar2;
}

Assistant:

pattern* numericItem(int signFactor) {
   pattern *lhs, *rhs, *rrs;
   int inscode = 0;

   lhs = makeTerminal(RES_NODE, signFactor*tokenval);
   inscode = lexbuf[0];
   matchTok(NUM_TOK);

   if (isalpha(inscode) || inscode == ' ') { /* combine res# with insert code */
      rhs = makeTerminal(INS_NODE, inscode);
      lhs = makeNode(lhs, rhs, AND_NODE);
   }

   if (lookahead == '-') { /* first dash is the range separator */
      matchTok('-');

      signFactor = +1;
      if (lookahead == '-') { /* this dash specifies a negative num */
         matchTok('-');
         signFactor = -1;
      }
      rhs = makeTerminal(RES_NODE, signFactor*tokenval);
      inscode = lexbuf[0];
      matchTok(NUM_TOK);

      if (isalpha(inscode) || inscode == ' ') {  /* combine res# with insert code */
         rrs = makeTerminal(INS_NODE, inscode);
         rhs = makeNode(rhs, rrs, AND_NODE);
      }

      if ((lhs->type == AND_NODE)|| (rhs->type == AND_NODE)) {
        /* more than just a span of numbers */
	/* includes insert codes            */
        lhs = makeNode(lhs, rhs, INS_RANGE_NODE);
      }
      else {
        lhs = makeNode(lhs, rhs, RANGE_NODE);
      }
   }
   return lhs;
}